

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceLayerParams::SerializeWithCachedSizes
          (ReduceLayerParams *this,CodedOutputStream *output)

{
  ReduceLayerParams_ReduceOperation RVar1;
  ReduceLayerParams_ReduceAxis RVar2;
  float fVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ReduceLayerParams *this_local;
  
  RVar1 = mode(this);
  if (RVar1 != ReduceLayerParams_ReduceOperation_SUM) {
    RVar1 = mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,RVar1,output);
  }
  fVar3 = epsilon(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = epsilon(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar3,output);
  }
  RVar2 = axis(this);
  if (RVar2 != ReduceLayerParams_ReduceAxis_CHW) {
    RVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(3,RVar2,output);
  }
  return;
}

Assistant:

void ReduceLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReduceLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.ReduceLayerParams.ReduceOperation mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // float epsilon = 2;
  if (this->epsilon() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->epsilon(), output);
  }

  // .CoreML.Specification.ReduceLayerParams.ReduceAxis axis = 3;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReduceLayerParams)
}